

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_AdderTree(FILE *pFile,int nArgs,int nBits)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  char *in_stack_ffffffffffffffc8;
  int Log2;
  int nDigits;
  int k;
  int i;
  int nBits_local;
  int nArgs_local;
  FILE *pFile_local;
  
  uVar2 = Abc_Base10Log(nBits);
  iVar3 = Abc_Base2Log(nArgs);
  if ((1 < nArgs) && (1 < nBits)) {
    fprintf((FILE *)pFile,"module adder_tree_%d_%d (\n   ",(ulong)(uint)nArgs,(ulong)(uint)nBits);
    nDigits = 0;
    while (nDigits < nBits) {
      for (Log2 = 0; Log2 < nArgs; Log2 = Log2 + 1) {
        fprintf((FILE *)pFile," i%0*d_%0*d,",(ulong)uVar2,(ulong)(uint)Log2,(ulong)uVar2,
                (ulong)(uint)((nBits + -1) - nDigits));
      }
      nDigits = nDigits + 1;
      fprintf((FILE *)pFile,"\n   ");
    }
    fprintf((FILE *)pFile," z\n");
    fprintf((FILE *)pFile,"  );\n");
    for (nDigits = 0; nDigits < nBits; nDigits = nDigits + 1) {
      fprintf((FILE *)pFile,"  input");
      for (Log2 = 0; Log2 < nArgs; Log2 = Log2 + 1) {
        in_stack_ffffffffffffffc8 = ",";
        if (Log2 == nArgs + -1) {
          in_stack_ffffffffffffffc8 = "";
        }
        fprintf((FILE *)pFile," i%0*d_%0*d%s",(ulong)uVar2,(ulong)(uint)Log2,(ulong)uVar2,
                (ulong)(uint)((nBits + -1) - nDigits),in_stack_ffffffffffffffc8);
      }
      fprintf((FILE *)pFile,";\n");
    }
    fprintf((FILE *)pFile,"  output [%d:0] z;\n",(ulong)((nBits + iVar3) - 1));
    for (nDigits = 0; nDigits < nArgs; nDigits = nDigits + 1) {
      fprintf((FILE *)pFile,"  wire [%d:0] t%d = {",(ulong)(nBits - 1),(ulong)(uint)nDigits);
      for (Log2 = 0; Log2 < nBits; Log2 = Log2 + 1) {
        in_stack_ffffffffffffffc8 = ",";
        if (Log2 == nBits + -1) {
          in_stack_ffffffffffffffc8 = "";
        }
        fprintf((FILE *)pFile," i%0*d_%0*d%s",(ulong)uVar2,(ulong)(uint)nDigits,(ulong)uVar2,
                (ulong)(uint)((nBits + -1) - Log2),in_stack_ffffffffffffffc8);
      }
      fprintf((FILE *)pFile," };\n");
    }
    for (nDigits = 0; nDigits < nArgs + -1; nDigits = nDigits + 1) {
      pcVar1 = "v+ 4Dvk v6gU 7vU v>7U vU7H gU7v 6UvM v6U+Q Vv6 g6Vv 7Ulv 7vUl> 7Vv y7V t6 t";
      if (nDigits != 0) {
        pcVar1 = "cQ b(N b+N D(bN c+N N.b( +8bN bD(N. +8cN bQ( b+Q b(QD cQ+ Qjb( +Qb8 bQDj( s";
      }
      in_stack_ffffffffffffffc8 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),nDigits);
      fprintf((FILE *)pFile,"  wire [%d:0] s%d = t%d + %s%d;\n",(ulong)((nBits + iVar3) - 1),
              (ulong)(nDigits + 1),(ulong)(nDigits + 1),pcVar1 + 0x4a,in_stack_ffffffffffffffc8);
    }
    fprintf((FILE *)pFile,"  assign z = s%d;\n",(ulong)(nArgs - 1));
    fprintf((FILE *)pFile,"endmodule\n\n");
    return;
  }
  __assert_fail("nArgs > 1 && nBits > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                ,0x347,"void Abc_AdderTree(FILE *, int, int)");
}

Assistant:

void Abc_AdderTree( FILE * pFile, int nArgs, int nBits )
{
    int i, k, nDigits = Abc_Base10Log( nBits ), Log2 = Abc_Base2Log( nArgs );
    assert( nArgs > 1 && nBits > 1 );
    fprintf( pFile, "module adder_tree_%d_%d (\n   ", nArgs, nBits );
    for ( i = 0; i < nBits; i++, fprintf(pFile, "\n   ") )
        for ( k = 0; k < nArgs; k++ )
            fprintf( pFile, " i%0*d_%0*d,", nDigits, k, nDigits, nBits-1-i );
    fprintf( pFile, " z\n" );
    fprintf( pFile, "  );\n" );
    for ( i = 0; i < nBits; i++ )
    {
        fprintf( pFile, "  input" );
        for ( k = 0; k < nArgs; k++ )
            fprintf( pFile, " i%0*d_%0*d%s", nDigits, k, nDigits, nBits-1-i, k==nArgs-1 ? "":"," );
        fprintf( pFile, ";\n" );
    }
    fprintf( pFile, "  output [%d:0] z;\n", nBits+Log2-1 );
    for ( i = 0; i < nArgs; i++ )
    {
        fprintf( pFile, "  wire [%d:0] t%d = {", nBits-1, i );
        for ( k = 0; k < nBits; k++ )
            fprintf( pFile, " i%0*d_%0*d%s", nDigits, i, nDigits, nBits-1-k, k==nBits-1 ? "":"," );
        fprintf( pFile, " };\n" );
    }
    for ( i = 0; i < nArgs-1; i++ )
        fprintf( pFile, "  wire [%d:0] s%d = t%d + %s%d;\n", nBits+Log2-1, i+1, i+1, i ? "s":"t", i );
    fprintf( pFile, "  assign z = s%d;\n", nArgs-1 );
    fprintf( pFile, "endmodule\n\n" ); 
}